

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token * __thiscall punky::lex::Lexer::next_token(Token *__return_storage_ptr__,Lexer *this)

{
  undefined8 *puVar1;
  byte ch;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *p_Var2;
  bool bVar3;
  char cVar4;
  int iVar5;
  const_iterator cVar6;
  char *pcVar7;
  pointer pcVar8;
  char *pcVar9;
  TokenType type;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Token tok;
  string ident;
  undefined1 local_4fb;
  undefined1 local_4fa;
  undefined1 local_4f9;
  TokenType local_4f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4f0;
  bool local_4d0;
  string local_4c8;
  undefined1 local_4a8 [24];
  undefined1 auStack_490 [16];
  bool local_480 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_408;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_3b8;
  undefined1 local_390 [32];
  bool local_370;
  TokenType local_364 [7];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_348;
  bool local_328 [8];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_320;
  bool local_300;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2f8;
  bool local_2d8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2d0;
  bool local_2b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2a8;
  bool local_288;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_280;
  bool local_260;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_258;
  bool local_238;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_230;
  bool local_210;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_208;
  bool local_1e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1e0;
  bool local_1c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1b8;
  bool local_198;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_190;
  bool local_170;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_168;
  bool local_148;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_140;
  bool local_120;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_118;
  bool local_f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_f0;
  bool local_d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_c8;
  bool local_a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a0;
  bool local_80;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_78;
  bool local_58;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  char local_30;
  
  skip_whitespace(this);
  local_4f8 = LeftParen;
  local_4d0 = false;
  ch = this->m_curr_char;
  if (0x7a < ch) {
    if (ch == 0x7b) {
      local_288 = false;
      punky::tok::make_token((Token *)local_4a8,LeftBrace,(TokenLiteral *)&local_2a8);
      local_4f8 = local_4a8._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4f0,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a8 + 8));
      if ((local_480[0] == true) &&
         (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
        operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
      }
      if ((local_288 == true) &&
         (local_288 = false,
         local_2a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2a8._M_value + 0x10)))
      goto LAB_00107d85;
    }
    else {
      if (ch != 0x7d) goto switchD_001071a7_caseD_22;
      local_2b0 = false;
      punky::tok::make_token((Token *)local_4a8,RightBrace,(TokenLiteral *)&local_2d0);
      local_4f8 = local_4a8._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4f0,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a8 + 8));
      if ((local_480[0] == true) &&
         (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
        operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
      }
      if ((local_2b0 == true) &&
         (local_2b0 = false, local_2a8._16_8_ = local_2d0._16_8_,
         local_2a8._M_value._M_dataplus._M_p = local_2d0._M_value._M_dataplus._M_p,
         local_2d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2d0._M_value + 0x10)))
      goto LAB_00107d85;
    }
    goto LAB_00107d8d;
  }
  switch(ch) {
  case 0x21:
    pcVar7 = (this->m_curr_it)._M_current + 1;
    pcVar9 = (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length;
    if ((pcVar7 == pcVar9) || (*pcVar7 != '=')) {
      local_d0 = false;
      punky::tok::make_token((Token *)local_4a8,Bang,(TokenLiteral *)&local_f0);
      local_4f8 = local_4a8._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4f0,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a8 + 8));
      if ((local_480[0] == true) &&
         (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
        operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
      }
      if ((local_d0 == true) &&
         (local_d0 = false, local_2a8._16_8_ = local_f0._16_8_,
         local_2a8._M_value._M_dataplus._M_p = local_f0._M_value._M_dataplus._M_p,
         local_f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_f0._M_value + 0x10)))
      goto LAB_00107d85;
    }
    else {
      if (pcVar7 == pcVar9) {
        cVar4 = '\0';
      }
      else {
        (this->m_curr_it)._M_current = pcVar7;
        cVar4 = *pcVar7;
      }
      this->m_curr_char = cVar4;
      local_a8 = false;
      punky::tok::make_token((Token *)local_4a8,BangEqual,(TokenLiteral *)&local_c8);
      local_4f8 = local_4a8._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4f0,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a8 + 8));
      if ((local_480[0] == true) &&
         (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
        operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
      }
      if ((local_a8 == true) &&
         (local_a8 = false, local_2a8._16_8_ = local_c8._16_8_,
         local_2a8._M_value._M_dataplus._M_p = local_c8._M_value._M_dataplus._M_p,
         local_c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_c8._M_value + 0x10)))
      goto LAB_00107d85;
    }
    break;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
switchD_001071a7_caseD_22:
    bVar3 = utils::is_letter(ch);
    if (bVar3) {
      tokenize_identifier_abi_cxx11_(&local_4c8,this);
      if ((token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_ == '\0') &&
         (iVar5 = __cxa_guard_acquire(&token_type(std::__cxx11::string_const&)::
                                       M_KEYWORDS_abi_cxx11_), iVar5 != 0)) {
        local_364[6] = 0x19;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[3],_punky::tok::TokenType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
                    *)local_4a8,(char (*) [3])"fn",local_364 + 6);
        local_364[5] = 0x1a;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[4],_punky::tok::TokenType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
                    *)local_480,(char (*) [4])"let",local_364 + 5);
        local_364[4] = 0x1b;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[5],_punky::tok::TokenType,_true>
                  (&local_458,(char (*) [5])"true",local_364 + 4);
        local_364[3] = 0x1c;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[6],_punky::tok::TokenType,_true>
                  (&local_430,(char (*) [6])"false",local_364 + 3);
        local_364[2] = 0x1d;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[3],_punky::tok::TokenType,_true>
                  (&local_408,(char (*) [3])"if",local_364 + 2);
        local_364[1] = 0x1e;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[5],_punky::tok::TokenType,_true>
                  (&local_3e0,(char (*) [5])"else",local_364 + 1);
        local_364[0] = Return;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[7],_punky::tok::TokenType,_true>
                  (&local_3b8,(char (*) [7])"return",local_364);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,punky::tok::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,punky::tok::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,punky::tok::TokenType>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,punky::tok::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,punky::tok::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_,local_4a8,
                   local_390,0,&local_4f9,&local_4fa,&local_4fb);
        lVar10 = -0x118;
        paVar11 = &local_3b8.first.field_2;
        do {
          if (paVar11 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar11->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar11->_M_allocated_capacity)[-2],
                            paVar11->_M_allocated_capacity + 1);
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar11->_M_allocated_capacity + -5);
          lVar10 = lVar10 + 0x28;
        } while (lVar10 != 0);
        __cxa_atexit(std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>_>
                     ::~unordered_map,token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_
                     ,&__dso_handle);
        __cxa_guard_release(&token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_);
      }
      cVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_,&local_4c8);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_true>
          ._M_cur == (__node_type *)0x0) {
        type = Identifier;
      }
      else {
        type = *(TokenType *)
                ((long)cVar6.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_true>
                       ._M_cur + 0x28);
      }
      if (type == Identifier) {
        local_348._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_348._M_value + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p == &local_4c8.field_2) {
          local_348._24_8_ = local_4c8.field_2._8_8_;
        }
        else {
          local_348._M_value._M_dataplus._M_p =
               (_Alloc_hider)(_Alloc_hider)local_4c8._M_dataplus._M_p;
        }
        local_348._M_value._M_string_length = local_4c8._M_string_length;
        local_4c8._M_string_length = 0;
        local_4c8.field_2._M_local_buf[0] = '\0';
        local_328[0] = true;
        local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        punky::tok::make_token(__return_storage_ptr__,Identifier,(TokenLiteral *)&local_348);
      }
      else {
        local_30 = '\0';
        punky::tok::make_token(__return_storage_ptr__,type,(TokenLiteral *)&local_50._M_value);
      }
      if (type == Identifier) {
        if (local_328[0] == true) {
          p_Var2 = &local_348;
LAB_00107f2d:
          paVar11 = &(p_Var2->_M_value).field_2;
          *(undefined1 *)(&paVar11->_M_allocated_capacity + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar11->_M_allocated_capacity)[-2] != paVar11) {
            operator_delete((undefined1 *)(&paVar11->_M_allocated_capacity)[-2],
                            paVar11->_M_allocated_capacity + 1);
          }
        }
      }
      else if (local_30 == '\x01') {
        p_Var2 = &local_50;
        goto LAB_00107f2d;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p == &local_4c8.field_2) goto LAB_00107e0a;
      local_2f8._16_8_ =
           CONCAT71(local_4c8.field_2._M_allocated_capacity._1_7_,local_4c8.field_2._M_local_buf[0])
      ;
      local_2f8._M_value._M_dataplus._M_p = (_Alloc_hider)local_4c8._M_dataplus._M_p;
    }
    else {
      bVar3 = utils::is_digit(this->m_curr_char);
      if (!bVar3) {
        local_300 = false;
        punky::tok::make_token((Token *)local_4a8,Illegal,(TokenLiteral *)&local_320);
        local_4f8 = local_4a8._0_4_;
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4f0,
                         (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_4a8 + 8));
        if ((local_480[0] == true) &&
           (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
          operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
        }
        if ((local_300 == true) &&
           (local_300 = false, local_2a8._16_8_ = local_320._16_8_,
           local_2a8._M_value._M_dataplus._M_p = local_320._M_value._M_dataplus._M_p,
           local_320._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_320._M_value + 0x10)))
        goto LAB_00107d85;
        break;
      }
      tokenize_integer_abi_cxx11_((string *)local_4a8,this);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_4a8 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._0_8_ == paVar11) {
        local_390._24_8_ = auStack_490._0_8_;
        local_390._0_8_ = local_390 + 0x10;
      }
      else {
        local_390._0_8_ = local_4a8._0_8_;
      }
      local_390._17_7_ = local_4a8._17_7_;
      local_390[0x10] = local_4a8[0x10];
      local_390._8_8_ = local_4a8._8_8_;
      local_4a8._8_8_ = (pointer)0x0;
      local_4a8[0x10] = '\0';
      local_370 = true;
      local_4a8._0_8_ = paVar11;
      punky::tok::make_token(__return_storage_ptr__,Int,(TokenLiteral *)local_390);
      if ((local_370 == true) &&
         (local_370 = false, (undefined1 *)local_390._0_8_ != local_390 + 0x10)) {
        operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._0_8_ == paVar11) goto LAB_00107e0a;
      local_2f8._16_8_ = CONCAT71(local_4a8._17_7_,local_4a8[0x10]);
      local_2f8._M_value._M_dataplus._M_p = (_Alloc_hider)local_4a8._0_8_;
    }
    goto LAB_00107f5c;
  case 0x28:
    local_210 = false;
    punky::tok::make_token((Token *)local_4a8,LeftParen,(TokenLiteral *)&local_230);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_210 == true) &&
       (local_210 = false, local_2a8._16_8_ = local_230._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_230._M_value._M_dataplus._M_p,
       local_230._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_230._M_value + 0x10))) {
LAB_00107d85:
      operator_delete((void *)local_2a8._M_value._M_dataplus._M_p,local_2a8._16_8_ + 1);
    }
    break;
  case 0x29:
    local_238 = false;
    punky::tok::make_token((Token *)local_4a8,RightParen,(TokenLiteral *)&local_258);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_238 == true) &&
       (local_238 = false, local_2a8._16_8_ = local_258._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_258._M_value._M_dataplus._M_p,
       local_258._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_258._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  case 0x2a:
    local_170 = false;
    punky::tok::make_token((Token *)local_4a8,Asterisk,(TokenLiteral *)&local_190);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_170 == true) &&
       (local_170 = false, local_2a8._16_8_ = local_190._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_190._M_value._M_dataplus._M_p,
       local_190._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_190._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  case 0x2b:
    local_f8 = false;
    punky::tok::make_token((Token *)local_4a8,Plus,(TokenLiteral *)&local_118);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_f8 == true) &&
       (local_f8 = false, local_2a8._16_8_ = local_118._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_118._M_value._M_dataplus._M_p,
       local_118._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_118._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  case 0x2c:
    local_260 = false;
    punky::tok::make_token((Token *)local_4a8,Comma,(TokenLiteral *)&local_280);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_260 == true) &&
       (local_260 = false, local_2a8._16_8_ = local_280._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_280._M_value._M_dataplus._M_p,
       local_280._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_280._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  case 0x2d:
    local_120 = false;
    punky::tok::make_token((Token *)local_4a8,Minus,(TokenLiteral *)&local_140);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_120 == true) &&
       (local_120 = false, local_2a8._16_8_ = local_140._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_140._M_value._M_dataplus._M_p,
       local_140._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_140._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  case 0x2f:
    local_148 = false;
    punky::tok::make_token((Token *)local_4a8,Slash,(TokenLiteral *)&local_168);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_148 == true) &&
       (local_148 = false, local_2a8._16_8_ = local_168._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_168._M_value._M_dataplus._M_p,
       local_168._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_168._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  case 0x3b:
    local_1e8 = false;
    punky::tok::make_token((Token *)local_4a8,Semicolon,(TokenLiteral *)&local_208);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_1e8 == true) &&
       (local_1e8 = false, local_2a8._16_8_ = local_208._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_208._M_value._M_dataplus._M_p,
       local_208._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_208._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  case 0x3c:
    local_198 = false;
    punky::tok::make_token((Token *)local_4a8,Less,(TokenLiteral *)&local_1b8);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_198 == true) &&
       (local_198 = false, local_2a8._16_8_ = local_1b8._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_1b8._M_value._M_dataplus._M_p,
       local_1b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1b8._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  case 0x3d:
    pcVar7 = (this->m_curr_it)._M_current + 1;
    pcVar9 = (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length;
    if ((pcVar7 == pcVar9) || (*pcVar7 != '=')) {
      local_80 = false;
      punky::tok::make_token((Token *)local_4a8,Equal,(TokenLiteral *)&local_a0);
      local_4f8 = local_4a8._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4f0,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a8 + 8));
      if ((local_480[0] == true) &&
         (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
        operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
      }
      if ((local_80 == true) &&
         (local_80 = false, local_2a8._16_8_ = local_a0._16_8_,
         local_2a8._M_value._M_dataplus._M_p = local_a0._M_value._M_dataplus._M_p,
         local_a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a0._M_value + 0x10)))
      goto LAB_00107d85;
    }
    else {
      if (pcVar7 == pcVar9) {
        cVar4 = '\0';
      }
      else {
        (this->m_curr_it)._M_current = pcVar7;
        cVar4 = *pcVar7;
      }
      this->m_curr_char = cVar4;
      local_58 = false;
      punky::tok::make_token((Token *)local_4a8,EqualEqual,(TokenLiteral *)&local_78);
      local_4f8 = local_4a8._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4f0,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a8 + 8));
      if ((local_480[0] == true) &&
         (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
        operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
      }
      if ((local_58 == true) &&
         (local_58 = false, local_2a8._16_8_ = local_78._16_8_,
         local_2a8._M_value._M_dataplus._M_p = local_78._M_value._M_dataplus._M_p,
         local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)))
      goto LAB_00107d85;
    }
    break;
  case 0x3e:
    local_1c0 = false;
    punky::tok::make_token((Token *)local_4a8,Greater,(TokenLiteral *)&local_1e0);
    local_4f8 = local_4a8._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a8 + 8));
    if ((local_480[0] == true) &&
       (local_480[0] = false, (undefined1 *)local_4a8._8_8_ != auStack_490)) {
      operator_delete((void *)local_4a8._8_8_,auStack_490._0_8_ + 1);
    }
    if ((local_1c0 == true) &&
       (local_1c0 = false, local_2a8._16_8_ = local_1e0._16_8_,
       local_2a8._M_value._M_dataplus._M_p = local_1e0._M_value._M_dataplus._M_p,
       local_1e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1e0._M_value + 0x10)))
    goto LAB_00107d85;
    break;
  default:
    if (ch != 0) goto switchD_001071a7_caseD_22;
    local_2d8 = false;
    punky::tok::make_token(__return_storage_ptr__,EOS,(TokenLiteral *)&local_2f8);
    if ((local_2d8 != true) ||
       (local_2d8 = false,
       local_2f8._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_2f8._M_value + 0x10)))
    goto LAB_00107e0a;
LAB_00107f5c:
    operator_delete((void *)local_2f8._M_value._M_dataplus._M_p,local_2f8._16_8_ + 1);
    goto LAB_00107e0a;
  }
LAB_00107d8d:
  pcVar8 = (this->m_curr_it)._M_current + 1;
  if (pcVar8 == (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length) {
    cVar4 = '\0';
  }
  else {
    (this->m_curr_it)._M_current = pcVar8;
    cVar4 = *pcVar8;
  }
  this->m_curr_char = cVar4;
  __return_storage_ptr__->m_type = local_4f8;
  (__return_storage_ptr__->m_literal).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  if (local_4d0 == true) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_literal).
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_literal).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload = puVar1;
    if (local_4f0._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_4f0._M_value + 0x10)) {
      *puVar1 = CONCAT71(local_4f0._17_7_,local_4f0._16_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_literal).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload + 0x18) = local_4f0._24_8_;
    }
    else {
      (__return_storage_ptr__->m_literal).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (pointer)local_4f0._M_value._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_literal).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10) = CONCAT71(local_4f0._17_7_,local_4f0._16_1_);
    }
    (__return_storage_ptr__->m_literal).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = local_4f0._M_value._M_string_length;
    local_4f0._M_value._M_string_length = 0;
    local_4f0._16_1_ = 0;
    (__return_storage_ptr__->m_literal).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
    local_4f0._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_4f0._M_value + 0x10);
  }
LAB_00107e0a:
  if ((local_4d0 == true) &&
     (local_4d0 = false,
     local_4f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4f0._M_value + 0x10))) {
    operator_delete((void *)local_4f0._M_value._M_dataplus._M_p,
                    CONCAT71(local_4f0._17_7_,local_4f0._16_1_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::next_token()
{
    skip_whitespace();

    auto tok = Token{};
    switch (m_curr_char)
    {
        case '=':
            if (peek().has_value() && peek().value() == '=')
            {
                consume();
                tok = make_token(TokenType::EqualEqual, std::nullopt);
            }
            else
                tok = make_token(TokenType::Equal, std::nullopt);
            break;
        case '!':
            if (peek().has_value() && peek().value() == '=')
            {
                consume();
                tok = make_token(TokenType::BangEqual, std::nullopt);
            }
            else
                tok = make_token(TokenType::Bang, std::nullopt);
            break;
        // clang-format off
        case '+': tok = make_token(TokenType::Plus, std::nullopt); break;
        case '-': tok = make_token(TokenType::Minus, std::nullopt); break;
        case '/': tok = make_token(TokenType::Slash, std::nullopt); break;
        case '*': tok = make_token(TokenType::Asterisk, std::nullopt); break;
        case '<': tok = make_token(TokenType::Less, std::nullopt); break;
        case '>': tok = make_token(TokenType::Greater, std::nullopt); break;
        case ';': tok = make_token(TokenType::Semicolon, std::nullopt); break;
        case '(': tok = make_token(TokenType::LeftParen, std::nullopt); break;
        case ')': tok = make_token(TokenType::RightParen, std::nullopt); break;
        case ',': tok = make_token(TokenType::Comma, std::nullopt); break;
        case '{': tok = make_token(TokenType::LeftBrace, std::nullopt); break;
        case '}': tok = make_token(TokenType::RightBrace, std::nullopt); break;
        case  0 : return make_token(TokenType::EOS, std::nullopt);
        // clang-format on
        default:
            if (utils::is_letter(m_curr_char))
            {
                auto       ident = tokenize_identifier();
                const auto type  = token_type(ident);
                return type == TokenType::Identifier ? make_token(type, std::move(ident))
                                                     : make_token(type, std::nullopt);
            }
            else if (utils::is_digit(m_curr_char))
                return make_token(TokenType::Int, tokenize_integer());
            else
                tok = make_token(TokenType::Illegal, std::nullopt);
            break;
    }

    consume();
    return tok;
}